

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
cpp_client::Any::Any<std::__cxx11::string>
          (Any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> this_00;
  
  this_00._M_head_impl = (holder *)operator_new(0x28);
  holder2<std::__cxx11::string>::holder2<std::__cxx11::string>
            ((holder2<std::__cxx11::string> *)this_00._M_head_impl,other);
  (this->data_)._M_t.
  super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>._M_t
  .super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>.
  super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

Any(T&& other) noexcept :
      data_(new holder2<T>(std::forward<T>(other)))
   {
      ;
   }